

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

int32_t icu_63::CalendarCache::get(CalendarCache **cache,int32_t key,UErrorCode *status)

{
  int32_t iVar1;
  CalendarCache *pCVar2;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  umtx_lock_63(&ccLock);
  pCVar2 = *cache;
  if (pCVar2 == (CalendarCache *)0x0) {
    createCache(cache,status);
    iVar1 = 0;
    if (U_ZERO_ERROR < *status) goto LAB_00293396;
    pCVar2 = *cache;
  }
  iVar1 = uhash_igeti_63(pCVar2->fTable,key);
LAB_00293396:
  umtx_unlock_63(&ccLock);
  return iVar1;
}

Assistant:

int32_t CalendarCache::get(CalendarCache** cache, int32_t key, UErrorCode &status) {
    int32_t res;

    if(U_FAILURE(status)) {
        return 0;
    }
    umtx_lock(&ccLock);

    if(*cache == NULL) {
        createCache(cache, status);
        if(U_FAILURE(status)) {
            umtx_unlock(&ccLock);
            return 0;
        }
    }

    res = uhash_igeti((*cache)->fTable, key);
    U_DEBUG_ASTRO_MSG(("%p: GET: [%d] == %d\n", (*cache)->fTable, key, res));

    umtx_unlock(&ccLock);
    return res;
}